

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::addEndpoint(CoreBroker *this,ActionMessage *message)

{
  GlobalFederateId fed_id;
  InterfaceHandle IVar1;
  byte *pbVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  BaseTimeCoordinator *pBVar6;
  string_view type;
  string_view units;
  bool bVar7;
  int iVar8;
  string *psVar9;
  BasicHandleInfo *handleInfo;
  string_view key;
  ActionMessage add;
  ActionMessage local_e8;
  
  bVar7 = checkInterfaceCreation(this,message,ENDPOINT);
  if (bVar7) {
    fed_id.gid = (message->source_id).gid;
    IVar1.hid = (message->source_handle).hid;
    pbVar2 = (message->payload).heap;
    sVar3 = (message->payload).bufferSize;
    psVar9 = ActionMessage::getString_abi_cxx11_(message,0);
    pcVar4 = (psVar9->_M_dataplus)._M_p;
    sVar5 = psVar9->_M_string_length;
    psVar9 = ActionMessage::getString_abi_cxx11_(message,1);
    type._M_str = pcVar4;
    type._M_len = sVar5;
    units._M_str = (psVar9->_M_dataplus)._M_p;
    units._M_len = psVar9->_M_string_length;
    key._M_str = (char *)pbVar2;
    key._M_len = sVar3;
    handleInfo = HandleManager::addHandle(&this->handles,fed_id,IVar1,ENDPOINT,key,type,units);
    addLocalInfo(this,handleInfo,message);
    if ((this->super_BrokerBase).field_0x294 != '\0') {
      findAndNotifyEndpointTargets(this,handleInfo,&handleInfo->key);
      return;
    }
    (*(this->super_Broker)._vptr_Broker[0x22])(this,0,message);
    if ((((this->super_BrokerBase).hasTimeDependency == false) &&
        ((this->super_BrokerBase).globalTime == false)) &&
       ((this->super_BrokerBase).asyncTime == false)) {
      pBVar6 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      iVar8 = (*pBVar6->_vptr_BaseTimeCoordinator[4])
                        (pBVar6,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid);
      if ((char)iVar8 != '\0') {
        (this->super_BrokerBase).hasTimeDependency = true;
        ActionMessage::ActionMessage
                  (&local_e8,cmd_add_interdependency,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                   (GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
        local_e8.flags._1_1_ = local_e8.flags._1_1_ | 0x40;
        (*(this->super_Broker)._vptr_Broker[0x22])(this,0,&local_e8);
        pBVar6 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar6->_vptr_BaseTimeCoordinator[5])
                  (pBVar6,(ulong)(uint)(this->super_BrokerBase).higher_broker_id.gid);
        BaseTimeCoordinator::setAsParent
                  ((this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
                   (GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
        ActionMessage::~ActionMessage(&local_e8);
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::addEndpoint(ActionMessage& message)
{
    if (!checkInterfaceCreation(message, InterfaceType::ENDPOINT)) {
        return;
    }
    auto& ept = handles.addHandle(message.source_id,
                                  message.source_handle,
                                  InterfaceType::ENDPOINT,
                                  message.name(),
                                  message.getString(typeStringLoc),
                                  message.getString(unitStringLoc));

    addLocalInfo(ept, message);

    if (!isRootc) {
        transmit(parent_route_id, message);
        if (!hasTimeDependency && !globalTime && !asyncTime) {
            if (timeCoord->addDependency(higher_broker_id)) {
                hasTimeDependency = true;
                ActionMessage add(CMD_ADD_INTERDEPENDENCY,
                                  global_broker_id_local,
                                  higher_broker_id);
                setActionFlag(add, child_flag);
                transmit(parent_route_id, add);

                timeCoord->addDependent(higher_broker_id);
                timeCoord->setAsParent(higher_broker_id);
            }
        }
    } else {
        findAndNotifyEndpointTargets(ept, ept.key);
    }
}